

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmState *pcVar7;
  cmPropertyDefinition *pcVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  pointer pbVar12;
  string *psVar13;
  byte bVar14;
  ulong uVar15;
  OutType infoType;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string name;
  string propertyName;
  string test_directory;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  cmMakefile *test_directory_makefile;
  ScopeType local_154;
  string local_130;
  string local_110;
  string local_f0;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  string local_b8;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmMakefile *local_38;
  
  name_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name_00) < 0x41) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  infoType = OutValue;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar4 = std::__cxx11::string::compare((char *)(name_00 + 1));
  if (iVar4 == 0) {
    local_154 = GLOBAL;
LAB_00247d11:
    bVar2 = false;
LAB_00247d1a:
    bVar3 = false;
LAB_00247d23:
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_c0 = 0;
    local_c8 = 0;
    local_d0 = 0;
    if (0x40 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12)) {
      iVar4 = 1;
      infoType = OutValue;
      local_d0 = 0;
      local_c8 = 0;
      local_c0 = 0;
      uVar10 = 2;
      uVar15 = 3;
      do {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar12 + uVar10));
        if (iVar5 == 0) {
          iVar4 = 2;
          goto LAB_00247f72;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        iVar11 = 0;
        if (iVar5 == 0) {
          infoType = OutBriefDoc;
          iVar4 = iVar11;
          goto LAB_00247f72;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar5 == 0) {
          infoType = OutFullDoc;
          iVar4 = iVar11;
          goto LAB_00247f72;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar5 == 0) {
          infoType = OutSet;
          iVar4 = iVar11;
          goto LAB_00247f72;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar5 == 0) {
          infoType = OutDefined;
          iVar4 = 0;
          goto LAB_00247f72;
        }
        psVar13 = &local_110;
        if (iVar4 == 1) goto switchD_00247f24_caseD_6;
        if (iVar4 == 0 && bVar2) {
          uVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar10));
          if ((int)uVar6 == 0) {
            local_d0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
            iVar4 = 4;
          }
          else {
            uVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar10));
            if ((int)uVar6 != 0) goto LAB_00247e8a;
            local_c8 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
            iVar4 = 5;
          }
          goto LAB_00247f72;
        }
LAB_00247e8a:
        if (iVar4 == 0 && bVar3) {
          uVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar10));
          if ((int)uVar6 != 0) goto switchD_00247f24_caseD_3;
          local_c0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
          iVar4 = 6;
          goto LAB_00247f72;
        }
        if (4 < iVar4 - 2U) {
switchD_00247f24_caseD_3:
          cmStrCat<char_const(&)[25],std::__cxx11::string_const&,char_const(&)[3]>
                    (&local_130,(char (*) [25])"given invalid argument \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar10,(char (*) [3])0x7e992c);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00248300;
        }
        this = &local_58;
        psVar13 = &local_b8;
        switch(iVar4) {
        case 2:
          psVar13 = &local_f0;
        case 6:
switchD_00247f24_caseD_6:
          std::__cxx11::string::_M_assign((string *)psVar13);
          iVar4 = 0;
          break;
        case 3:
          goto switchD_00247f24_caseD_3;
        case 5:
          this = &local_78;
        case 4:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar10);
          iVar4 = iVar11;
        }
LAB_00247f72:
        pbVar12 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar15 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12
                                >> 5);
        uVar10 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar1);
    }
    if (local_f0._M_string_length != 0) {
      local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar14 = (byte)local_c8;
      bVar2 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        (status,(bool)((byte)local_d0 & 1),(bool)(bVar14 & 1),&local_58,&local_78,
                         &local_98);
      bVar3 = SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                        (status,(bool)((byte)local_c0 & 1),&local_b8,&local_38);
      if (bVar2 && bVar3) {
        if (infoType == OutDefined) {
          pcVar7 = cmMakefile::GetState(status->Makefile);
          pcVar8 = cmState::GetPropertyDefinition(pcVar7,&local_f0,local_154);
          pcVar9 = "1";
          if (pcVar8 == (cmPropertyDefinition *)0x0) {
            pcVar9 = "0";
          }
          bVar2 = true;
          value_01._M_str = pcVar9;
          value_01._M_len = 1;
          cmMakefile::AddDefinition(status->Makefile,name_00,value_01);
        }
        else {
          if (infoType == OutFullDoc) {
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            local_130._M_string_length = 0;
            local_130.field_2._M_local_buf[0] = '\0';
            pcVar7 = cmMakefile::GetState(status->Makefile);
            pcVar8 = cmState::GetPropertyDefinition(pcVar7,&local_f0,local_154);
            if (pcVar8 != (cmPropertyDefinition *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_130);
            }
            if (local_130._M_string_length == 0) {
              std::__cxx11::string::operator=((string *)&local_130,"NOTFOUND");
            }
            value_00._M_str = local_130._M_dataplus._M_p;
            value_00._M_len = local_130._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,name_00,value_00);
          }
          else {
            if (infoType != OutBriefDoc) {
              bVar2 = true;
              switch(local_154) {
              case TARGET:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleTargetMode
                                  (status,&local_110,infoType,name_00,&local_f0);
                break;
              case SOURCE_FILE:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleSourceMode
                                  (status,&local_110,infoType,name_00,&local_f0,
                                   *local_98.
                                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                   (bool)((bVar14 | (byte)local_d0) & 1));
                break;
              case DIRECTORY:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleDirectoryMode
                                  (status,&local_110,infoType,name_00,&local_f0);
                break;
              case GLOBAL:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleGlobalMode
                                  (status,(string *)local_110._M_string_length,infoType,name_00,
                                   &local_f0);
                break;
              case CACHE:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleCacheMode
                                  (status,&local_110,infoType,name_00,&local_f0);
                break;
              case TEST:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleTestMode
                                  (status,&local_110,infoType,name_00,&local_f0,local_38);
                break;
              case VARIABLE:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleVariableMode
                                  (status,(string *)local_110._M_string_length,infoType,name_00,
                                   &local_f0);
                break;
              case INSTALL:
                bVar2 = anon_unknown.dwarf_6d04a8::HandleInstallMode
                                  (status,&local_110,infoType,name_00,&local_f0);
              }
              goto switchD_0024825a_caseD_7;
            }
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            local_130._M_string_length = 0;
            local_130.field_2._M_local_buf[0] = '\0';
            pcVar7 = cmMakefile::GetState(status->Makefile);
            pcVar8 = cmState::GetPropertyDefinition(pcVar7,&local_f0,local_154);
            if (pcVar8 != (cmPropertyDefinition *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_130);
            }
            if (local_130._M_string_length == 0) {
              std::__cxx11::string::operator=((string *)&local_130,"NOTFOUND");
            }
            value._M_str = local_130._M_dataplus._M_p;
            value._M_len = local_130._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,name_00,value);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
switchD_0024825a_caseD_7:
      if (local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00248429;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"not given a PROPERTY <name> argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
LAB_00248115:
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = DIRECTORY;
      goto LAB_00247d11;
    }
    local_154 = TARGET;
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) goto LAB_00247d11;
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = SOURCE_FILE;
      bVar2 = true;
      goto LAB_00247d1a;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = TEST;
      bVar3 = true;
      bVar2 = false;
      goto LAB_00247d23;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = VARIABLE;
      goto LAB_00247d11;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = CACHE;
      goto LAB_00247d11;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar4 == 0) {
      local_154 = INSTALL;
      goto LAB_00247d11;
    }
    cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[87]>
              (&local_130,(char (*) [21])"given invalid scope ",
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,
               (char (*) [87])
               ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00248300:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_00248115;
  }
  bVar2 = false;
LAB_00248429:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  std::string test_directory;
  bool test_directory_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory,
    DoingTestDirectory,
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::TEST &&
               args[i] == "DIRECTORY") {
      doing = DoingTestDirectory;
      test_directory_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingTestDirectory) {
      test_directory = args[i];
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool source_file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  cmMakefile* test_directory_makefile;
  bool test_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!(source_file_scopes_handled && test_scopes_handled)) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName,
                              *test_directory_makefile);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}